

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::CreatePegoutAddressRequest::CreatePegoutAddressRequest
          (CreatePegoutAddressRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreatePegoutAddressRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreatePegoutAddressRequest_00a90660;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->network_)._M_dataplus._M_p = (pointer)&(this->network_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->network_,"mainnet","");
  (this->elements_network_)._M_dataplus._M_p = (pointer)&(this->elements_network_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->elements_network_,"mainnet","");
  (this->descriptor_)._M_dataplus._M_p = (pointer)&(this->descriptor_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->descriptor_,"");
  this->bip32_counter_ = 0;
  (this->hash_type_)._M_dataplus._M_p = (pointer)&(this->hash_type_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->hash_type_,"p2pkh","");
  CollectFieldName();
  return;
}

Assistant:

CreatePegoutAddressRequest() {
    CollectFieldName();
  }